

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

vector_t *** gauden_alloc_param(uint32 n_cb,uint32 n_feat,uint32 n_density,uint32 *veclen)

{
  uint32 uVar1;
  ulong uVar2;
  vector_t ***ppppfVar3;
  void *pvVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  size_t d2;
  
  if (n_feat == 0) {
    d2 = 0;
    iVar8 = 0;
  }
  else {
    d2 = (size_t)n_feat;
    uVar2 = 0;
    iVar8 = 0;
    do {
      iVar8 = iVar8 + veclen[uVar2];
      uVar2 = uVar2 + 1;
    } while (d2 != uVar2);
  }
  ppppfVar3 = (vector_t ***)
              __ckd_calloc_3d__((ulong)n_cb,d2,(ulong)n_density,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                ,0xd1);
  pvVar4 = __ckd_calloc__((ulong)(n_density * n_cb * iVar8),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0xd4);
  if (n_cb != 0) {
    uVar2 = 0;
    uVar5 = 0;
    do {
      if (n_feat != 0) {
        sVar6 = 0;
        do {
          if (n_density != 0) {
            uVar1 = veclen[sVar6];
            uVar7 = 0;
            do {
              ppppfVar3[uVar2][sVar6][uVar7] = (vector_t)((long)pvVar4 + (ulong)uVar5 * 4);
              uVar7 = uVar7 + 1;
              uVar5 = uVar5 + uVar1;
            } while (n_density != uVar7);
          }
          sVar6 = sVar6 + 1;
        } while (sVar6 != d2);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != n_cb);
  }
  return ppppfVar3;
}

Assistant:

vector_t ***
gauden_alloc_param(uint32 n_cb,
		   uint32 n_feat,
		   uint32 n_density,
		   const uint32 *veclen)
{
    uint32 blksize;
    vector_t ***param;
    float32 *buf;
    uint32 i, j, k, l;

    for (blksize = 0, j = 0; j < n_feat; j++)
	blksize += veclen[j];

    param = (vector_t ***) ckd_calloc_3d(n_cb, n_feat, n_density,
					 sizeof(vector_t));
    
    buf = ckd_calloc(n_cb * n_density * blksize,
		     sizeof(float32));

    for (i = 0, l = 0; i < n_cb; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		param[i][j][k] = &buf[l];

		l += veclen[j];
	    }
	}
    }
    
    return param;
}